

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

void getSWTRecCoeff(double *coeff,int *length,char *ctype,int level,int J,double *lpr,double *hpr,
                   int lf,int siglength,double *swtop)

{
  double *__s;
  int a;
  int iVar1;
  void *__s_00;
  void *__s_01;
  void *__ptr;
  void *__ptr_00;
  double *x;
  double *x_00;
  double *y;
  double *oup;
  double *oup_00;
  double *oup_01;
  double *oup_02;
  void *__ptr_01;
  double *array;
  long lVar2;
  ulong uVar3;
  double *pdVar4;
  uint uVar5;
  int N;
  size_t sVar6;
  void *__dest;
  uint uVar7;
  undefined4 in_register_00000084;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  int iVar11;
  size_t __size;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  double dVar15;
  undefined4 in_stack_0000001c;
  uint local_38;
  
  __s = (double *)CONCAT44(in_stack_0000001c,siglength);
  __size = (long)lf << 3;
  __s_00 = malloc(__size);
  __s_01 = malloc(__size);
  __ptr = malloc(__size);
  __ptr_00 = malloc(__size);
  x = (double *)malloc(__size);
  x_00 = (double *)malloc(__size);
  y = (double *)malloc(__size);
  sVar6 = (long)(int)((lf * 2 - (lf - (lf >> 0x1f) & 0xfffffffeU)) + (int)hpr) << 3;
  oup = (double *)malloc(sVar6);
  oup_00 = (double *)malloc(sVar6);
  sVar6 = (long)(lf + (int)hpr * 2) << 3;
  oup_01 = (double *)malloc(sVar6);
  oup_02 = (double *)malloc(sVar6);
  __ptr_01 = malloc(__size);
  array = (double *)malloc(__size);
  if (0 < (int)ctype) {
    uVar7 = level - (int)ctype;
    a = (int)(((ulong)hpr & 0xffffffff) >> 0x1f) + (int)hpr >> 1;
    sVar6 = (ulong)(uint)lf << 3;
    lVar2 = (long)((int)hpr + -1);
    local_38 = uVar7;
    do {
      if (0 < lf) {
        memset(__s,0,sVar6);
      }
      iVar1 = strcmp((char *)length,"appx");
      uVar5 = local_38 ^ uVar7;
      if (iVar1 == 0 && uVar5 == 0) {
        if (0 < lf) {
          memset(__s_01,0,sVar6);
          __dest = __s_00;
LAB_001074bb:
          memcpy(__dest,coeff,sVar6);
        }
      }
      else {
        iVar1 = strcmp((char *)length,"det");
        if (iVar1 == 0 && uVar5 == 0) {
          if (0 < lf) {
            memset(__s_00,0,sVar6);
            __dest = __s_01;
            goto LAB_001074bb;
          }
        }
        else if (0 < lf) {
          memset(__s_01,0,sVar6);
        }
      }
      dVar15 = ldexp(1.0,~local_38 + level);
      uVar5 = (uint)dVar15;
      if (0 < (int)uVar5) {
        uVar9 = (ulong)uVar5;
        uVar8 = 0;
        pdVar10 = __s;
        do {
          uVar12 = 0;
          lVar14 = 0;
          if ((int)uVar8 < lf) {
            lVar14 = 0;
            uVar3 = uVar8;
            do {
              *(undefined8 *)((long)__ptr + lVar14 * 8) = *(undefined8 *)((long)__s_00 + uVar3 * 8);
              *(undefined8 *)((long)__ptr_00 + lVar14 * 8) =
                   *(undefined8 *)((long)__s_01 + uVar3 * 8);
              lVar14 = lVar14 + 1;
              uVar3 = uVar3 + uVar9;
            } while ((int)uVar3 < lf);
          }
          uVar13 = (uint)lVar14;
          if (uVar13 != 0) {
            lVar14 = 0;
            uVar12 = 0;
            do {
              x[uVar12] = *(double *)((long)__ptr + lVar14);
              x_00[uVar12] = *(double *)((long)__ptr_00 + lVar14);
              uVar12 = uVar12 + 1;
              lVar14 = lVar14 + 0x10;
            } while ((uVar13 - 1 >> 1) + 1 != uVar12);
          }
          iVar11 = (int)uVar12;
          upsamp2(x,iVar11,2,y);
          per_ext(y,iVar11 * 2,a,oup);
          upsamp2(x_00,iVar11,2,y);
          per_ext(y,iVar11 * 2,a,oup_00);
          iVar1 = (int)hpr + iVar11 * 2;
          conv_direct(oup,iVar1,(double *)CONCAT44(in_register_00000084,J),(int)hpr,oup_01);
          conv_direct(oup_00,iVar1,lpr,(int)hpr,oup_02);
          if (iVar11 != 0) {
            iVar11 = iVar1 + -1;
            if (iVar1 + -1 < (int)hpr) {
              iVar11 = (int)hpr;
            }
            lVar14 = 0;
            do {
              *(double *)((long)__ptr_01 + lVar14 * 8 + lVar2 * 8 + (long)(int)hpr * -8 + 8) =
                   oup_01[lVar2 + lVar14] + oup_02[lVar2 + lVar14];
              lVar14 = lVar14 + 1;
            } while (iVar11 + (1 - (int)hpr) != (int)lVar14);
          }
          iVar1 = 0;
          if (1 < uVar13) {
            uVar13 = uVar13 - 2 >> 1;
            iVar1 = uVar13 + 1;
            lVar14 = 0;
            do {
              *(undefined8 *)((long)x + lVar14) = *(undefined8 *)((long)__ptr + lVar14 * 2 + 8);
              *(undefined8 *)((long)x_00 + lVar14) =
                   *(undefined8 *)((long)__ptr_00 + lVar14 * 2 + 8);
              lVar14 = lVar14 + 8;
            } while ((ulong)uVar13 * 8 + 8 != lVar14);
          }
          upsamp2(x,iVar1,2,y);
          iVar11 = iVar1 * 2;
          per_ext(y,iVar11,a,oup);
          upsamp2(x_00,iVar1,2,y);
          per_ext(y,iVar11,a,oup_00);
          N = (int)hpr + iVar1 * 2;
          conv_direct(oup,N,(double *)CONCAT44(in_register_00000084,J),(int)hpr,oup_01);
          conv_direct(oup_00,N,lpr,(int)hpr,oup_02);
          if (iVar1 != 0) {
            iVar1 = N + -1;
            if (N + -1 < (int)hpr) {
              iVar1 = (int)hpr;
            }
            lVar14 = 0;
            do {
              array[(lVar2 + lVar14 + 1) - (long)(int)hpr] =
                   oup_01[lVar2 + lVar14] + oup_02[lVar2 + lVar14];
              lVar14 = lVar14 + 1;
            } while (iVar1 + (1 - (int)hpr) != (int)lVar14);
          }
          circshift(array,iVar11,-1);
          if ((int)uVar8 < lf) {
            uVar12 = uVar8 & 0xffffffff;
            lVar14 = 0;
            pdVar4 = pdVar10;
            do {
              *pdVar4 = (*(double *)((long)__ptr_01 + lVar14) + *(double *)((long)array + lVar14)) *
                        0.5;
              lVar14 = lVar14 + 8;
              pdVar4 = pdVar4 + uVar9;
              uVar13 = (int)uVar12 + uVar5;
              uVar12 = (ulong)uVar13;
            } while ((int)uVar13 < lf);
          }
          uVar8 = uVar8 + 1;
          pdVar10 = pdVar10 + 1;
        } while (uVar8 != uVar9);
      }
      if (0 < lf) {
        memcpy(__s_00,__s,sVar6);
      }
      local_38 = local_38 + 1;
    } while ((int)local_38 < level);
  }
  free(__s_00);
  free(__s_01);
  free(__ptr);
  free(__ptr_00);
  free(y);
  free(oup);
  free(oup_00);
  free(oup_01);
  free(oup_02);
  free(__ptr_01);
  free(array);
  free(x);
  free(x_00);
  return;
}

Assistant:

static void getSWTRecCoeff(double *coeff, int *length, const char *ctype, int level, int J, double *lpr,
	double *hpr, int lf, int siglength, double *swtop) {
	int N, iter, i, index, value, count, len;
	int index_shift, len0, U, N1, index2;
	double *appx1, *det1, *appx_sig, *det_sig, *cL0, *cH0, *tempx, *oup00L, *oup00H, *oup00, *oup01, *appx2, *det2;

	N = siglength;
	U = 2;

	appx_sig = (double*)malloc(sizeof(double)* N);
	det_sig = (double*)malloc(sizeof(double)* N);
	appx1 = (double*)malloc(sizeof(double)* N);
	det1 = (double*)malloc(sizeof(double)* N);
	appx2 = (double*)malloc(sizeof(double)* N);
	det2 = (double*)malloc(sizeof(double)* N);
	tempx = (double*)malloc(sizeof(double)* N);
	cL0 = (double*)malloc(sizeof(double)* (N + (N % 2) + lf));
	cH0 = (double*)malloc(sizeof(double)* (N + (N % 2) + lf));
	oup00L = (double*)malloc(sizeof(double)* (N + 2 * lf));
	oup00H = (double*)malloc(sizeof(double)* (N + 2 * lf));
	oup00 = (double*)malloc(sizeof(double)* N);
	oup01 = (double*)malloc(sizeof(double)* N);



	for (iter = J-level; iter < J; ++iter) {
		for (i = 0; i < N; ++i) {
			swtop[i] = 0.0;
		}
		if (!strcmp((ctype), "appx") && (iter == (J-level))) {
			for (i = 0; i < N; ++i) {
				appx_sig[i] = coeff[i];
				det_sig[i] = 0.0;
			}
		}
		else if (!strcmp((ctype), "det") && (iter == (J-level))) {
			for (i = 0; i < N; ++i) {
				det_sig[i] = coeff[i];
				appx_sig[i] = 0.0;
			}
		}
		else {
			for (i = 0; i < N; ++i) {
				det_sig[i] = 0.0;
			}
		}

		value = (int)pow(2.0, (double)(J - 1 - iter));

		for (count = 0; count < value; count++) {
			len = 0;
			for (index = count; index < N; index += value) {
				appx1[len] = appx_sig[index];
				det1[len] = det_sig[index];
				len++;
			}


			//SHIFT 0
			len0 = 0;

			for (index_shift = 0; index_shift < len; index_shift += 2) {
				appx2[len0] = appx1[index_shift];
				det2[len0] = det1[index_shift];
				len0++;
			}
			upsamp2(appx2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cL0);

			upsamp2(det2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cH0);

			N1 = 2 * len0 + lf;


			
			conv_direct(cL0, N1, lpr, lf, oup00L);

			
			conv_direct(cH0, N1, hpr, lf, oup00H);

			for (i = lf - 1; i < 2 * len0 + lf - 1; ++i) {
				oup00[i - lf + 1] = oup00L[i] + oup00H[i];
			}

			//SHIFT 1

			len0 = 0;

			for (index_shift = 1; index_shift < len; index_shift += 2) {
				appx2[len0] = appx1[index_shift];
				det2[len0] = det1[index_shift];
				len0++;
			}

			upsamp2(appx2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cL0);

			upsamp2(det2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cH0);

			N1 = 2 * len0 + lf;

			conv_direct(cL0, N1, lpr, lf, oup00L);

			conv_direct(cH0, N1, hpr, lf, oup00H);

			for (i = lf - 1; i < 2 * len0 + lf - 1; ++i) {
				oup01[i - lf + 1] = oup00L[i] + oup00H[i];
			}

			circshift(oup01, 2 * len0, -1);

			index2 = 0;

			for (index = count; index < N; index += value) {
				swtop[index] = (oup00[index2] + oup01[index2]) / 2.0;
				index2++;
			}

		}
		for (i = 0; i < N; ++i) {
			appx_sig[i] = swtop[i];
		}

	}



	free(appx_sig);
	free(det_sig);
	free(appx1);
	free(det1);
	free(tempx);
	free(cL0);
	free(cH0);
	free(oup00L);
	free(oup00H);
	free(oup00);
	free(oup01);
	free(appx2);
	free(det2);
}